

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  short *psVar1;
  uchar uVar2;
  short sVar3;
  ushort uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  float fVar9;
  StbUndoRecord *pSVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  int temp;
  int iVar13;
  int iVar14;
  ImWchar *pIVar15;
  unsigned_short *puVar16;
  int *piVar17;
  int temp_1;
  int iVar18;
  ImStb *pIVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  float *pfVar26;
  ImFont *in_R8;
  int iVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  StbFindState find;
  ImWchar *local_60;
  float local_54;
  ImStb *local_50;
  ImWchar local_48 [6];
  int local_3c;
  int local_38;
  int local_34;
  
  state = &this->Stb;
  local_50 = (ImStb *)&(this->Stb).preferred_x;
  do {
    switch(key) {
    case 0x200000:
      iVar14 = (this->Stb).select_start;
      iVar18 = (this->Stb).select_end;
      if (iVar14 == iVar18) {
        if (0 < state->cursor) {
          state->cursor = state->cursor + -1;
        }
      }
      else {
        if (iVar18 < iVar14) {
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar18;
        }
        iVar14 = (this->Stb).select_start;
        (this->Stb).cursor = iVar14;
        (this->Stb).select_end = iVar14;
        (this->Stb).has_preferred_x = '\0';
      }
      goto LAB_0018d54f;
    case 0x200001:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        state->cursor = state->cursor + 1;
      }
      else {
        ImStb::stb_textedit_move_to_last(this,state);
      }
      ImStb::stb_textedit_clamp(this,state);
      goto LAB_0018d54f;
    case 0x200002:
switchD_0018cb97_caseD_200002:
      uVar22 = key & 0x400000;
      uVar2 = (this->Stb).single_line;
      if (uVar2 == '\0') {
        iVar14 = (this->Stb).select_start;
        iVar18 = (this->Stb).select_end;
        if (uVar22 == 0) {
          if (iVar14 != iVar18) {
            if (iVar18 < iVar14) {
              (this->Stb).select_end = iVar14;
              (this->Stb).select_start = iVar18;
            }
            iVar14 = (this->Stb).select_start;
            (this->Stb).cursor = iVar14;
            (this->Stb).select_end = iVar14;
            (this->Stb).has_preferred_x = '\0';
          }
        }
        else if (iVar14 == iVar18) {
          iVar14 = (this->Stb).cursor;
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar14;
        }
        else {
          state->cursor = iVar18;
        }
        ImStb::stb_textedit_clamp(this,state);
        ImStb::stb_textedit_find_charpos
                  ((ImStb *)local_48,(StbFindState *)this,
                   (ImGuiInputTextState *)(ulong)(uint)(this->Stb).cursor,
                   (uint)(this->Stb).single_line,(int)in_R8);
        if (local_34 != local_3c) {
          pIVar19 = local_50;
          if ((this->Stb).has_preferred_x == '\0') {
            pIVar19 = (ImStb *)local_48;
          }
          lVar20 = (long)local_34;
          local_54 = *(float *)pIVar19;
          (this->Stb).cursor = local_34;
          puVar16 = (this->TextW).Data;
          local_60 = (ImWchar *)0x0;
          pIVar15 = puVar16 + lVar20;
          InputTextCalcTextSizeW
                    (pIVar15,puVar16 + this->CurLenW,&local_60,(ImVec2 *)0x1,SUB81(in_R8,0));
          pIVar11 = GImGui;
          uVar28 = (uint)((ulong)((long)local_60 - (long)pIVar15) >> 1);
          if (0 < (int)uVar28) {
            puVar16 = (this->TextW).Data;
            iVar14 = (this->Stb).cursor;
            fVar29 = 0.0;
            uVar25 = 1;
            do {
              uVar4 = puVar16[lVar20 + (uVar25 - 1)];
              fVar30 = -1.0;
              if (uVar4 != 10) {
                in_R8 = pIVar11->Font;
                pfVar26 = &in_R8->FallbackAdvanceX;
                if ((int)(uint)uVar4 < (in_R8->IndexAdvanceX).Size) {
                  pfVar26 = (float *)((ulong)((uint)uVar4 * 4) + (long)(in_R8->IndexAdvanceX).Data);
                }
                fVar30 = (pIVar11->FontSize / in_R8->FontSize) * *pfVar26;
              }
              if (((fVar30 == -1.0) && (!NAN(fVar30))) ||
                 (fVar29 = fVar29 + fVar30, local_54 < fVar29)) {
                bVar12 = false;
              }
              else {
                iVar14 = iVar14 + 1;
                state->cursor = iVar14;
                bVar12 = true;
              }
            } while ((bVar12) &&
                    (bVar12 = uVar25 < (uVar28 & 0x7fffffff), uVar25 = uVar25 + 1, bVar12));
          }
          ImStb::stb_textedit_clamp(this,state);
          (this->Stb).has_preferred_x = '\x01';
          (this->Stb).preferred_x = local_54;
          if (uVar22 != 0) {
            (this->Stb).select_end = (this->Stb).cursor;
          }
        }
      }
      else {
        key = uVar22 | 0x200000;
      }
      break;
    case 0x200003:
switchD_0018cb97_caseD_200003:
      uVar22 = key & 0x400000;
      uVar2 = (this->Stb).single_line;
      if (uVar2 == '\0') {
        iVar14 = (this->Stb).select_start;
        iVar18 = (this->Stb).select_end;
        if (uVar22 == 0) {
          if (iVar14 != iVar18) {
            ImStb::stb_textedit_move_to_last(this,state);
          }
        }
        else if (iVar14 == iVar18) {
          iVar14 = (this->Stb).cursor;
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar14;
        }
        else {
          state->cursor = iVar18;
        }
        ImStb::stb_textedit_clamp(this,state);
        ImStb::stb_textedit_find_charpos
                  ((ImStb *)local_48,(StbFindState *)this,
                   (ImGuiInputTextState *)(ulong)(uint)(this->Stb).cursor,
                   (uint)(this->Stb).single_line,(int)in_R8);
        if ((long)local_38 != 0) {
          pIVar19 = local_50;
          if ((this->Stb).has_preferred_x == '\0') {
            pIVar19 = (ImStb *)local_48;
          }
          fVar29 = *(float *)pIVar19;
          lVar20 = (long)local_3c + (long)local_38;
          (this->Stb).cursor = (int)lVar20;
          puVar16 = (this->TextW).Data;
          local_60 = (ImWchar *)0x0;
          pIVar15 = puVar16 + lVar20;
          InputTextCalcTextSizeW
                    (pIVar15,puVar16 + this->CurLenW,&local_60,(ImVec2 *)0x1,SUB81(in_R8,0));
          pIVar11 = GImGui;
          uVar28 = (uint)((ulong)((long)local_60 - (long)pIVar15) >> 1);
          if (0 < (int)uVar28) {
            puVar16 = (this->TextW).Data;
            iVar14 = (this->Stb).cursor;
            fVar30 = 0.0;
            uVar25 = 1;
            do {
              uVar4 = puVar16[lVar20 + (uVar25 - 1)];
              fVar9 = -1.0;
              if (uVar4 != 10) {
                in_R8 = pIVar11->Font;
                pfVar26 = &in_R8->FallbackAdvanceX;
                if ((int)(uint)uVar4 < (in_R8->IndexAdvanceX).Size) {
                  pfVar26 = (float *)((ulong)((uint)uVar4 * 4) + (long)(in_R8->IndexAdvanceX).Data);
                }
                fVar9 = (pIVar11->FontSize / in_R8->FontSize) * *pfVar26;
              }
              if (((fVar9 == -1.0) && (!NAN(fVar9))) || (fVar30 = fVar30 + fVar9, fVar29 < fVar30))
              {
                bVar12 = false;
              }
              else {
                iVar14 = iVar14 + 1;
                state->cursor = iVar14;
                bVar12 = true;
              }
            } while ((bVar12) &&
                    (bVar12 = uVar25 < (uVar28 & 0x7fffffff), uVar25 = uVar25 + 1, bVar12));
          }
          ImStb::stb_textedit_clamp(this,state);
          (this->Stb).has_preferred_x = '\x01';
          (this->Stb).preferred_x = fVar29;
          if (uVar22 != 0) {
            (this->Stb).select_end = (this->Stb).cursor;
          }
        }
      }
      else {
        key = uVar22 | 0x200001;
      }
      break;
    case 0x200004:
      ImStb::stb_textedit_clamp(this,state);
      iVar14 = (this->Stb).select_start;
      iVar18 = (this->Stb).select_end;
      if (iVar14 != iVar18) {
        if (iVar18 < iVar14) {
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar18;
        }
        iVar14 = (this->Stb).select_start;
        (this->Stb).cursor = iVar14;
        (this->Stb).select_end = iVar14;
        (this->Stb).has_preferred_x = '\0';
      }
      if ((this->Stb).single_line != '\0') {
        state->cursor = 0;
        goto LAB_0018d54f;
      }
      if ((long)state->cursor < 1) goto LAB_0018d54f;
      puVar16 = (this->TextW).Data;
      lVar20 = (long)state->cursor;
      goto LAB_0018d580;
    case 0x200005:
      iVar14 = this->CurLenW;
      ImStb::stb_textedit_clamp(this,state);
      iVar18 = (this->Stb).select_start;
      iVar27 = (this->Stb).select_end;
      if (iVar18 != iVar27) {
        if (iVar27 < iVar18) {
          (this->Stb).select_end = iVar18;
          (this->Stb).select_start = iVar27;
        }
        iVar18 = (this->Stb).select_start;
        (this->Stb).cursor = iVar18;
        (this->Stb).select_end = iVar18;
        (this->Stb).has_preferred_x = '\0';
      }
      if ((this->Stb).single_line != '\0') {
        state->cursor = iVar14;
        goto LAB_0018d54f;
      }
      iVar18 = state->cursor;
      if (iVar14 <= iVar18) goto LAB_0018d54f;
      puVar16 = (this->TextW).Data + iVar18;
      goto LAB_0018d5b6;
    case 0x200006:
      (this->Stb).select_end = 0;
      (this->Stb).cursor = 0;
      (this->Stb).select_start = 0;
      goto LAB_0018d54f;
    case 0x200007:
      (this->Stb).cursor = this->CurLenW;
      (this->Stb).select_start = 0;
      (this->Stb).select_end = 0;
      goto LAB_0018d54f;
    case 0x200008:
switchD_0018cb97_caseD_200008:
      if ((this->Stb).select_start != (this->Stb).select_end) goto LAB_0018cfc5;
      iVar14 = (this->Stb).cursor;
      if (iVar14 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar14,1);
      }
      goto LAB_0018d54f;
    case 0x200009:
switchD_0018cb97_caseD_200009:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_clamp(this,state);
        iVar14 = (this->Stb).cursor;
        if (0 < iVar14) {
          ImStb::stb_textedit_delete(this,state,iVar14 + -1,1);
          (this->Stb).cursor = (this->Stb).cursor + -1;
        }
      }
      else {
LAB_0018cfc5:
        ImStb::stb_textedit_delete_selection(this,state);
      }
      goto LAB_0018d54f;
    case 0x20000a:
      lVar20 = (long)(this->Stb).undostate.undo_point;
      if (lVar20 == 0) goto LAB_0018d54f;
      iVar14 = (this->Stb).undostate.undo_rec[lVar20 + -1].where;
      iVar18 = (this->Stb).undostate.undo_rec[lVar20 + -1].insert_length;
      uVar22 = (this->Stb).undostate.undo_rec[lVar20 + -1].delete_length;
      sVar3 = (this->Stb).undostate.redo_point;
      uVar25 = (ulong)sVar3;
      iVar27 = (this->Stb).undostate.undo_rec[lVar20 + -1].char_storage;
      (this->Stb).undostate.undo_rec[uVar25 - 1].char_storage = -1;
      (this->Stb).undostate.undo_rec[uVar25 - 1].insert_length = uVar22;
      (this->Stb).undostate.undo_rec[uVar25 - 1].delete_length = iVar18;
      (this->Stb).undostate.undo_rec[uVar25 - 1].where = iVar14;
      if ((ulong)uVar22 == 0) goto LAB_0018d834;
      iVar24 = (this->Stb).undostate.undo_char_point + uVar22;
      if (0x3e6 < iVar24) {
        (this->Stb).undostate.undo_rec[uVar25 - 1].insert_length = 0;
        goto LAB_0018d821;
      }
      iVar13 = (this->Stb).undostate.redo_char_point;
      bVar12 = iVar13 < iVar24;
      if (iVar24 <= iVar13) goto LAB_0018d7c5;
      if (sVar3 == 99) goto LAB_0018d54f;
      local_50 = (ImStb *)(this->Stb).undostate.undo_char;
      goto LAB_0018d667;
    case 0x20000b:
      lVar20 = (long)(this->Stb).undostate.redo_point;
      if (lVar20 != 99) {
        sVar3 = (this->Stb).undostate.undo_point;
        iVar14 = (this->Stb).undostate.undo_rec[lVar20].where;
        iVar18 = (this->Stb).undostate.undo_rec[lVar20].insert_length;
        uVar22 = (this->Stb).undostate.undo_rec[lVar20].delete_length;
        iVar27 = (this->Stb).undostate.undo_rec[lVar20].char_storage;
        (this->Stb).undostate.undo_rec[sVar3].delete_length = iVar18;
        (this->Stb).undostate.undo_rec[sVar3].insert_length = uVar22;
        (this->Stb).undostate.undo_rec[sVar3].where = iVar14;
        (this->Stb).undostate.undo_rec[sVar3].char_storage = -1;
        if ((ulong)uVar22 != 0) {
          iVar24 = (this->Stb).undostate.undo_char_point;
          if ((this->Stb).undostate.redo_char_point < (int)(iVar24 + uVar22)) {
            pSVar10 = (this->Stb).undostate.undo_rec + sVar3;
            pSVar10->insert_length = 0;
            pSVar10->delete_length = 0;
          }
          else {
            (this->Stb).undostate.undo_rec[sVar3].char_storage = iVar24;
            (this->Stb).undostate.undo_char_point = iVar24 + uVar22;
            if (0 < (int)uVar22) {
              puVar16 = (this->TextW).Data;
              uVar25 = 0;
              do {
                (this->Stb).undostate.undo_char[(long)iVar24 + uVar25] =
                     puVar16[(long)iVar14 + uVar25];
                uVar25 = uVar25 + 1;
              } while (uVar22 != uVar25);
            }
          }
          ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar22);
        }
        if (iVar18 != 0) {
          ImStb::STB_TEXTEDIT_INSERTCHARS
                    (this,iVar14,(this->Stb).undostate.undo_char + iVar27,iVar18);
          piVar17 = &(this->Stb).undostate.redo_char_point;
          *piVar17 = *piVar17 + iVar18;
        }
        (this->Stb).cursor = iVar18 + iVar14;
        uVar5 = (this->Stb).undostate.undo_point;
        uVar7 = (this->Stb).undostate.redo_point;
        (this->Stb).undostate.undo_point = uVar5 + 1;
        (this->Stb).undostate.redo_point = uVar7 + 1;
      }
      goto LAB_0018d54f;
    case 0x20000c:
      iVar14 = (this->Stb).select_start;
      iVar18 = (this->Stb).select_end;
      if (iVar14 == iVar18) {
        uVar22 = state->cursor;
        uVar28 = (int)uVar22 >> 0x1f & uVar22;
        goto LAB_0018d135;
      }
      if (iVar18 < iVar14) {
        (this->Stb).select_end = iVar14;
        (this->Stb).select_start = iVar18;
      }
      iVar14 = (this->Stb).select_start;
      (this->Stb).cursor = iVar14;
      goto LAB_0018d54c;
    case 0x20000d:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        iVar14 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
        (this->Stb).cursor = iVar14;
        goto LAB_0018d5ea;
      }
      ImStb::stb_textedit_move_to_last(this,state);
      goto LAB_0018d553;
    default:
      switch(key) {
      case 0x600000:
        ImStb::stb_textedit_clamp(this,state);
        iVar14 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar14) {
          iVar14 = (this->Stb).cursor;
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar14;
        }
        else {
          state->cursor = iVar14;
        }
        iVar14 = (this->Stb).select_end;
        if (0 < iVar14) {
          (this->Stb).select_end = iVar14 + -1;
        }
        break;
      case 0x600001:
        iVar14 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar14) {
          iVar14 = (this->Stb).cursor;
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar14;
        }
        else {
          state->cursor = iVar14;
        }
        piVar17 = &(this->Stb).select_end;
        *piVar17 = *piVar17 + 1;
        ImStb::stb_textedit_clamp(this,state);
        break;
      case 0x600002:
        goto switchD_0018cb97_caseD_200002;
      case 0x600003:
        goto switchD_0018cb97_caseD_200003;
      case 0x600004:
        ImStb::stb_textedit_clamp(this,state);
        iVar14 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar14) {
          iVar14 = (this->Stb).cursor;
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar14;
        }
        else {
          state->cursor = iVar14;
        }
        if ((this->Stb).single_line != '\0') {
          state->cursor = 0;
          goto LAB_0018d549;
        }
        if ((long)state->cursor < 1) goto LAB_0018d549;
        puVar16 = (this->TextW).Data;
        lVar20 = (long)state->cursor;
        goto LAB_0018d4f9;
      case 0x600005:
        iVar14 = this->CurLenW;
        ImStb::stb_textedit_clamp(this,state);
        iVar18 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar18) {
          iVar18 = (this->Stb).cursor;
          (this->Stb).select_end = iVar18;
          (this->Stb).select_start = iVar18;
        }
        else {
          state->cursor = iVar18;
        }
        if ((this->Stb).single_line != '\0') {
          state->cursor = iVar14;
          goto LAB_0018d549;
        }
        iVar18 = state->cursor;
        if (iVar14 <= iVar18) goto LAB_0018d549;
        puVar16 = (this->TextW).Data + iVar18;
        goto LAB_0018d52f;
      case 0x600006:
        iVar14 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar14) {
          iVar14 = (this->Stb).cursor;
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar14;
        }
        else {
          state->cursor = iVar14;
        }
        iVar14 = 0;
        goto LAB_0018d479;
      case 0x600007:
        iVar14 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar14) {
          iVar14 = (this->Stb).cursor;
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar14;
        }
        else {
          state->cursor = iVar14;
        }
        iVar14 = this->CurLenW;
LAB_0018d479:
        (this->Stb).select_end = iVar14;
        goto LAB_0018d47c;
      case 0x600008:
        goto switchD_0018cb97_caseD_200008;
      case 0x600009:
        goto switchD_0018cb97_caseD_200009;
      default:
        uVar22 = 0;
        if (key < 0x200000) {
          uVar22 = key;
        }
        if (((int)uVar22 < 1) ||
           ((local_48[0] = (ImWchar)uVar22, uVar22 == 10 && ((this->Stb).single_line != '\0'))))
        goto LAB_0018d553;
        if (((this->Stb).insert_mode == '\0') ||
           ((this->Stb).select_start != (this->Stb).select_end)) {
LAB_0018d5f4:
          ImStb::stb_textedit_delete_selection(this,state);
          bVar12 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
          if (!bVar12) goto LAB_0018d553;
          ImStb::stb_text_createundo(&(this->Stb).undostate,(this->Stb).cursor,0,1);
        }
        else {
          iVar14 = (this->Stb).cursor;
          if (this->CurLenW <= iVar14) goto LAB_0018d5f4;
          pIVar15 = ImStb::stb_text_createundo(&(this->Stb).undostate,iVar14,1,1);
          if (pIVar15 != (ImWchar *)0x0) {
            *pIVar15 = (this->TextW).Data[iVar14];
          }
          ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
          bVar12 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
          if (!bVar12) goto LAB_0018d553;
        }
        (this->Stb).cursor = (this->Stb).cursor + 1;
        goto LAB_0018d54f;
      case 0x60000c:
        if ((this->Stb).select_start == (this->Stb).select_end) {
          iVar14 = (this->Stb).cursor;
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar14;
        }
        uVar22 = state->cursor;
        uVar28 = (int)uVar22 >> 0x1f & uVar22;
        goto LAB_0018d074;
      case 0x60000d:
        if ((this->Stb).select_start == (this->Stb).select_end) {
          iVar14 = (this->Stb).cursor;
          (this->Stb).select_end = iVar14;
          (this->Stb).select_start = iVar14;
        }
        iVar14 = this->CurLenW;
        iVar18 = (this->Stb).cursor;
        iVar27 = iVar18 + 1;
        if (iVar18 + 1 < iVar14) {
          iVar27 = iVar14;
        }
        goto LAB_0018d0ce;
      }
      iVar14 = (this->Stb).select_end;
LAB_0018d47c:
      (this->Stb).cursor = iVar14;
      goto LAB_0018d54f;
    }
  } while (uVar2 != '\0');
  goto LAB_0018d553;
  while (iVar13 = ImStb::is_word_boundary_from_right(this,iVar18), iVar24 = iVar18, iVar13 == 0) {
LAB_0018d0ce:
    iVar18 = iVar18 + 1;
    iVar24 = iVar27;
    if (iVar14 <= iVar18) break;
  }
  if (iVar24 < iVar14) {
    iVar14 = iVar24;
  }
  (this->Stb).cursor = iVar14;
  (this->Stb).select_end = iVar14;
  goto LAB_0018d5ea;
  while( true ) {
    uVar22 = uVar22 - 1;
    iVar14 = ImStb::is_word_boundary_from_right(this,uVar22);
    uVar23 = uVar22;
    if (iVar14 != 0) break;
LAB_0018d074:
    uVar23 = uVar28 - 1;
    if ((int)uVar22 < 1) break;
  }
  uVar22 = 0;
  if (0 < (int)uVar23) {
    uVar22 = uVar23;
  }
  (this->Stb).cursor = uVar22;
  (this->Stb).select_end = uVar22;
  goto LAB_0018d5ea;
  while( true ) {
    state->cursor = iVar18;
    puVar16 = puVar16 + 1;
    if (iVar18 == iVar14) break;
LAB_0018d52f:
    iVar18 = iVar18 + 1;
    if (*puVar16 == 10) break;
  }
  goto LAB_0018d549;
  while( true ) {
    state->cursor = (int)lVar20 + -1;
    bVar12 = lVar20 < 2;
    lVar20 = lVar20 + -1;
    if (bVar12) break;
LAB_0018d4f9:
    if (puVar16[lVar20 + -1] == 10) break;
  }
LAB_0018d549:
  iVar14 = (this->Stb).cursor;
LAB_0018d54c:
  (this->Stb).select_end = iVar14;
  goto LAB_0018d54f;
  while( true ) {
    uVar22 = uVar22 - 1;
    iVar14 = ImStb::is_word_boundary_from_right(this,uVar22);
    uVar23 = uVar22;
    if (iVar14 != 0) break;
LAB_0018d135:
    uVar23 = uVar28 - 1;
    if ((int)uVar22 < 1) break;
  }
  uVar22 = 0;
  if (0 < (int)uVar23) {
    uVar22 = uVar23;
  }
  (this->Stb).cursor = uVar22;
LAB_0018d5ea:
  ImStb::stb_textedit_clamp(this,state);
  goto LAB_0018d553;
  while (uVar4 = (this->Stb).undostate.redo_point, uVar25 = (ulong)uVar4, uVar4 != 99) {
LAB_0018d667:
    if ((short)uVar25 < 99) {
      if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
        iVar24 = (this->Stb).undostate.undo_rec[0x62].insert_length;
        lVar20 = (long)(this->Stb).undostate.redo_char_point + (long)iVar24;
        iVar13 = (int)lVar20;
        (this->Stb).undostate.redo_char_point = iVar13;
        memmove(local_50 + lVar20 * 2,local_50 + lVar20 * 2 + (long)iVar24 * -2,
                (long)(999 - iVar13) * 2);
        lVar20 = (long)(this->Stb).undostate.redo_point;
        if (lVar20 < 0x62) {
          lVar21 = lVar20 + -0x62;
          piVar17 = &(this->Stb).undostate.undo_rec[lVar20].char_storage;
          do {
            if (-1 < *piVar17) {
              *piVar17 = *piVar17 + iVar24;
            }
            piVar17 = piVar17 + 4;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0);
        }
      }
      lVar20 = (long)(this->Stb).undostate.redo_point;
      memmove((this->Stb).undostate.undo_rec + lVar20 + 1,(this->Stb).undostate.undo_rec + lVar20,
              lVar20 * -0x10 + 0x620);
      psVar1 = &(this->Stb).undostate.redo_point;
      *psVar1 = *psVar1 + 1;
    }
    iVar24 = (this->Stb).undostate.undo_char_point + uVar22;
    iVar13 = (this->Stb).undostate.redo_char_point;
    bVar12 = iVar13 < iVar24;
    if (iVar24 <= iVar13) goto LAB_0018d7c5;
  }
  goto LAB_0018d54f;
LAB_0018d7c5:
  (this->Stb).undostate.undo_rec[(long)(this->Stb).undostate.redo_point + -1].char_storage =
       iVar13 - uVar22;
  (this->Stb).undostate.redo_char_point = iVar13 - uVar22;
  if (0 < (int)uVar22) {
    puVar16 = (this->TextW).Data;
    uVar25 = 0;
    do {
      *(unsigned_short *)
       ((long)this + uVar25 * 2 + (long)iVar13 * 2 + (long)(int)uVar22 * -2 + 0x694) =
           puVar16[(long)iVar14 + uVar25];
      uVar25 = uVar25 + 1;
    } while (uVar22 != uVar25);
  }
  if (!bVar12) {
LAB_0018d821:
    ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar22);
LAB_0018d834:
    if (iVar18 != 0) {
      ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar14,(this->Stb).undostate.undo_char + iVar27,iVar18);
      piVar17 = &(this->Stb).undostate.undo_char_point;
      *piVar17 = *piVar17 - iVar18;
    }
    (this->Stb).cursor = iVar18 + iVar14;
    uVar6 = (this->Stb).undostate.undo_point;
    uVar8 = (this->Stb).undostate.redo_point;
    (this->Stb).undostate.undo_point = uVar6 + -1;
    (this->Stb).undostate.redo_point = uVar8 + -1;
  }
  goto LAB_0018d54f;
  while( true ) {
    state->cursor = iVar18;
    puVar16 = puVar16 + 1;
    if (iVar18 == iVar14) break;
LAB_0018d5b6:
    iVar18 = iVar18 + 1;
    if (*puVar16 == 10) break;
  }
  goto LAB_0018d54f;
  while( true ) {
    state->cursor = (int)lVar20 + -1;
    bVar12 = lVar20 < 2;
    lVar20 = lVar20 + -1;
    if (bVar12) break;
LAB_0018d580:
    if (puVar16[lVar20 + -1] == 10) break;
  }
LAB_0018d54f:
  (this->Stb).has_preferred_x = '\0';
LAB_0018d553:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}